

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragScalarN(char *label,ImGuiDataType data_type,void *p_data,int components,
                       float v_speed,void *p_min,void *p_max,char *format,float power)

{
  bool bVar1;
  undefined4 in_ESI;
  void *in_RDI;
  float unaff_retaddr;
  int unaff_retaddr_00;
  void *in_stack_00000008;
  ImGuiSliderFlags drag_flags;
  ImGuiSliderFlags in_stack_00000038;
  undefined4 in_stack_fffffffffffffff0;
  
  bVar1 = DragScalarN((char *)p_max,(ImGuiDataType)power,in_stack_00000008,unaff_retaddr_00,
                      unaff_retaddr,in_RDI,(void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                      (char *)p_data,in_stack_00000038);
  return bVar1;
}

Assistant:

bool ImGui::DragScalarN(const char* label, ImGuiDataType data_type, void* p_data, int components, float v_speed, const void* p_min, const void* p_max, const char* format, float power)
{
    ImGuiSliderFlags drag_flags = ImGuiSliderFlags_None;
    if (power != 1.0f)
    {
        IM_ASSERT(power == 1.0f && "Call function with ImGuiSliderFlags_Logarithmic flags instead of using the old 'float power' function!");
        IM_ASSERT(p_min != NULL && p_max != NULL);  // When using a power curve the drag needs to have known bounds
        drag_flags |= ImGuiSliderFlags_Logarithmic;   // Fallback for non-asserting paths
    }
    return DragScalarN(label, data_type, p_data, components, v_speed, p_min, p_max, format, drag_flags);
}